

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkrequest.cpp
# Opt level: O2

void __thiscall QHttpNetworkRequest::setHTTP2Direct(QHttpNetworkRequest *this,bool b)

{
  QHttpNetworkRequestPrivate *pQVar1;
  
  pQVar1 = QSharedDataPointer<QHttpNetworkRequestPrivate>::operator->(&this->d);
  pQVar1->http2Direct = b;
  return;
}

Assistant:

void QHttpNetworkRequest::setHTTP2Direct(bool b)
{
    d->http2Direct = b;
}